

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

counting_iterator __thiscall
fmt::v6::internal::float_writer<char>::prettify<fmt::v6::internal::counting_iterator>
          (float_writer<char> *this,counting_iterator it)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  counting_iterator cVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int num_zeros;
  uint uVar13;
  int iVar14;
  long lVar15;
  byte bVar16;
  _Distance __n;
  ulong uVar17;
  
  uVar10 = this->num_digits_;
  uVar11 = this->exp_;
  lVar15 = (long)(int)uVar10;
  uVar13 = uVar11 + uVar10;
  uVar1 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar1 & 0xff) == 1) {
    lVar5 = (this->specs_).precision - lVar15;
    bVar16 = (byte)(uVar1 >> 0x15) & 0 < (int)lVar5;
    lVar15 = lVar15 + -1;
    if ((int)uVar10 < 2) {
      lVar15 = 0;
    }
    lVar15 = it.count_ + lVar15 + (ulong)(1 < (int)uVar10 | bVar16);
    if (bVar16 == 0) {
      lVar5 = 0;
    }
    uVar13 = uVar13 - 1;
    lVar12 = lVar5 + lVar15 + 3;
    uVar10 = -uVar13;
    if (0 < (int)uVar13) {
      uVar10 = uVar13;
    }
    lVar15 = lVar5 + 4 + lVar15;
    if (uVar10 < 1000) {
      lVar15 = lVar12;
    }
    lVar15 = lVar15 + 1;
    if (uVar10 < 100) {
      lVar15 = lVar12;
    }
  }
  else {
    if ((int)uVar11 < 0) {
      if ((int)uVar13 < 1) {
        iVar14 = -uVar13;
        iVar2 = (this->specs_).precision;
        iVar9 = iVar14;
        if (SBORROW4(iVar2,iVar14) != (int)(iVar2 + uVar13) < 0) {
          iVar9 = iVar2;
        }
        if (iVar2 < 0) {
          iVar9 = iVar14;
        }
        if (0 < (int)uVar10 && (uVar1 >> 0x15 & 1) == 0) {
          do {
            if (this->digits_[(ulong)uVar10 - 1] != '0') goto LAB_001216b7;
            bVar4 = 1 < (int)uVar10;
            uVar10 = uVar10 - 1;
          } while (bVar4);
          uVar10 = 0;
        }
        if (iVar9 == 0 && uVar10 == 0) {
          return (counting_iterator)(it.count_ + 1);
        }
LAB_001216b7:
        sVar6 = it.count_ + 3 + (ulong)(iVar9 - 1);
        if (iVar9 < 1) {
          sVar6 = it.count_ + 2;
        }
        cVar8.count_ = (long)(int)uVar10 + sVar6;
        if ((int)uVar10 < 1) {
          cVar8.count_ = sVar6;
        }
      }
      else {
        pcVar3 = this->digits_;
        uVar17 = (ulong)uVar13;
        pcVar7 = pcVar3 + uVar17 + (it.count_ - (long)pcVar3);
        if ((uVar1 >> 0x15 & 1) == 0) {
          uVar11 = uVar10 - 1;
          if ((int)uVar13 < (int)(uVar10 - 1)) {
            uVar11 = uVar13;
          }
          do {
            if (pcVar3[lVar15 + -1] != '0') {
              uVar11 = (uint)lVar15;
              break;
            }
            lVar15 = lVar15 + -1;
          } while ((long)uVar17 < lVar15);
          pcVar3 = pcVar3 + (it.count_ - (long)pcVar3) + (long)(int)uVar11;
          if ((int)uVar11 <= (int)uVar13) {
            pcVar3 = pcVar7;
          }
          return (counting_iterator)(size_t)(pcVar3 + (uVar11 != uVar13));
        }
        iVar2 = (this->specs_).precision;
        iVar9 = iVar2 - uVar10;
        cVar8.count_ = (size_t)(pcVar7 + (lVar15 - uVar17) + 1);
        if (iVar9 != 0 && (int)uVar10 <= iVar2) {
          if (0 < iVar9) {
            cVar8.count_ = (size_t)(pcVar7 + (ulong)(iVar9 - 1) + (lVar15 - uVar17) + 2);
          }
          return (counting_iterator)cVar8.count_;
        }
      }
      return (counting_iterator)cVar8.count_;
    }
    cVar8.count_ = lVar15 + it.count_;
    if ((int)uVar10 < 1) {
      cVar8.count_ = it.count_;
    }
    sVar6 = cVar8.count_ + uVar11;
    if ((uVar1 >> 0x15 & 1) == 0) {
      return (counting_iterator)sVar6;
    }
    iVar2 = (this->specs_).precision;
    iVar9 = iVar2 - uVar13;
    if (iVar9 != 0 && (int)uVar13 <= iVar2) {
      return (counting_iterator)(sVar6 + (iVar9 - 1) + 2);
    }
    lVar15 = sVar6 - ((uVar1 & 0xff) == 2);
  }
  return (counting_iterator)(lVar15 + 2);
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }